

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 GenStateFindLiteral(jx9_gen_state *pGen,SyString *pValue,sxu32 *pIdx)

{
  sxi32 sVar1;
  SyHashEntry_Pr *pSVar2;
  
  pSVar2 = (SyHashEntry_Pr *)0x0;
  if ((pValue->nByte != 0) && ((pGen->hLiteral).nEntry != 0)) {
    pSVar2 = HashGetEntry(&pGen->hLiteral,pValue->zString,pValue->nByte);
  }
  if (pSVar2 == (SyHashEntry_Pr *)0x0) {
    sVar1 = -6;
  }
  else {
    *pIdx = *(sxu32 *)&pSVar2->pUserData;
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

static sxi32 GenStateFindLiteral(jx9_gen_state *pGen, const SyString *pValue, sxu32 *pIdx)
{
	SyHashEntry *pEntry;
	pEntry = SyHashGet(&pGen->hLiteral, (const void *)pValue->zString, pValue->nByte);
	if( pEntry == 0 ){
		return SXERR_NOTFOUND;
	}
	*pIdx = (sxu32)SX_PTR_TO_INT(pEntry->pUserData);
	return SXRET_OK;
}